

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlIO.c
# Opt level: O0

int xmlFdWrite(void *context,char *buffer,int len)

{
  int iVar1;
  int iVar2;
  ssize_t sVar3;
  int *piVar4;
  int local_38;
  int bytes;
  int ret;
  int fd;
  xmlFdIOCtxt *fdctxt;
  char *pcStack_20;
  int len_local;
  char *buffer_local;
  void *context_local;
  
  iVar2 = *context;
  local_38 = 0;
  fdctxt._4_4_ = len;
  pcStack_20 = buffer;
  while( true ) {
    if (fdctxt._4_4_ < 1) {
      return local_38;
    }
    sVar3 = write(iVar2,pcStack_20,(long)fdctxt._4_4_);
    iVar1 = (int)sVar3;
    if (iVar1 < 0) break;
    local_38 = iVar1 + local_38;
    pcStack_20 = pcStack_20 + iVar1;
    fdctxt._4_4_ = fdctxt._4_4_ - iVar1;
  }
  piVar4 = __errno_location();
  iVar2 = xmlIOErr(*piVar4);
  return -iVar2;
}

Assistant:

static int
xmlFdWrite(void *context, const char *buffer, int len) {
    xmlFdIOCtxt *fdctxt = context;
    int fd = fdctxt->fd;
    int ret = 0;
    int bytes;

    while (len > 0) {
	bytes = write(fd, buffer, len);
	if (bytes < 0)
            return(-xmlIOErr(errno));
        ret += bytes;
        buffer += bytes;
        len -= bytes;
    }

    return(ret);
}